

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall
Sudoku::createFieldCopy
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *copiedFields)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Field *pFVar2;
  element_type *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  shared_ptr<Field> *psVar7;
  pointer psVar8;
  undefined1 local_a1;
  Sudoku *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  shared_ptr<Field> local_80;
  pointer local_70;
  shared_ptr<Field> *local_68;
  shared_ptr<Field> new_field;
  _Rb_tree_node_base *local_48;
  
  psVar7 = (this->field_begin_)._M_current;
  local_a0 = this;
  if ((this->field_end_)._M_current != psVar7) {
    do {
      pFVar2 = (psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_84 = Field::id(pFVar2);
      local_88 = Field::pos_x(pFVar2);
      local_8c = Field::pos_y(pFVar2);
      local_90 = Field::pos_z(pFVar2);
      local_94 = Field::max_value(pFVar2);
      new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Field,std::allocator<Field>,int,int,int,int,int>
                (&new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Field **)&new_field,(allocator<Field> *)&local_a1,&local_84,&local_88,&local_8c,
                 &local_90,&local_94);
      bVar3 = Field::fixed(pFVar2);
      this_00 = new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar3) {
        iVar4 = Field::value(pFVar2);
        Field::setValue(this_00,iVar4);
        Field::setFixed(new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true)
        ;
      }
      std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::push_back
                (copiedFields,&new_field);
      if (new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != (local_a0->field_end_)._M_current);
  }
  local_68 = (local_a0->field_begin_)._M_current;
  if ((local_a0->field_end_)._M_current != local_68) {
    local_70 = (copiedFields->
               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    p_Var1 = &new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    do {
      pFVar2 = (local_70->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      Field::dependencies((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                           *)&new_field,
                          (local_68->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      p_Var6 = local_48;
      if (local_48 != (_Rb_tree_node_base *)p_Var1) {
        do {
          iVar4 = Field::id(*(Field **)(p_Var6 + 1));
          for (psVar8 = (copiedFields->
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar8 != (copiedFields->
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
            iVar5 = Field::id((psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             );
            if (iVar5 == iVar4) {
              local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
              ;
              if (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                }
              }
              Field::addDependency(pFVar2,&local_80);
              if (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_80.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              break;
            }
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)p_Var1);
      }
      std::
      _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                   *)&new_field);
      local_68 = local_68 + 1;
      local_70 = local_70 + 1;
    } while (local_68 != (local_a0->field_end_)._M_current);
  }
  return;
}

Assistant:

void Sudoku::createFieldCopy(std::vector<std::shared_ptr<Field>> &copiedFields)
{
  // create new copy of fields
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++)
  {
    Field &field = **iter;
    // create new field with same properties as field
    std::shared_ptr<Field> new_field = std::make_shared<Field>(field.id(), field.pos_x(), field.pos_y(), field.pos_z(),
      field.max_value());

    // copy fixed state
    if(field.fixed())
    {
      new_field->setValue(field.value());
      new_field->setFixed(true);
    }

    copiedFields.push_back(new_field);
  }

  // create copy of dependencies
  FieldVector::iterator iter_new = copiedFields.begin();
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++, iter_new++)
  {
    Field &field = **iter;
    Field &new_field = **iter_new;
    // loop over all dependencies
    for(auto &dependency: field.dependencies())
    {
      int id = dependency->id();

      // find field with that id in copiedFields
      for(FieldVector::iterator iter_copy = copiedFields.begin(); iter_copy != copiedFields.end(); iter_copy++)
      {
        if((*iter_copy)->id() == id)
        {
          new_field.addDependency((*iter_copy));
          break;
        }
      }
    }
  }
}